

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

Node * __thiscall
SQCompilation::NameShadowingChecker::extractPointedNode(NameShadowingChecker *this,SymbolInfo *info)

{
  switch(info->kind) {
  case SK_EXCEPTION:
  case SK_FUNCTION:
  case SK_CLASS:
  case SK_TABLE:
  case SK_VAR:
  case SK_BINDING:
  case SK_CONST:
  case SK_ENUM:
  case SK_PARAM:
  case SK_FOREACH:
    return (Node *)(info->declaration).x;
  case SK_ENUM_CONST:
    return (Node *)((info->declaration).ec)->val;
  case SK_EXTERNAL_BINDING:
    return (Node *)&this->rootPointerNode;
  default:
    return (Node *)0x0;
  }
}

Assistant:

const Node *NameShadowingChecker::extractPointedNode(const SymbolInfo *info) {
  switch (info->kind)
  {
  case SK_EXCEPTION:
    return info->declaration.x;
  case SK_FUNCTION:
    return info->declaration.f;
  case SK_CLASS:
    return info->declaration.k;
  case SK_TABLE:
    return info->declaration.t;
  case SK_VAR:
  case SK_BINDING:
  case SK_FOREACH:
    return info->declaration.v;
  case SK_CONST:
    return info->declaration.c;
  case SK_ENUM:
    return info->declaration.e;
  case SK_ENUM_CONST:
    return info->declaration.ec->val;
  case SK_PARAM:
    return info->declaration.p;
  case SK_EXTERNAL_BINDING:
    return &rootPointerNode;
  default:
    assert(0);
    return nullptr;
  }
}